

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O2

void __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::set_flags
          (section_impl<ELFIO::Elf32_Shdr> *this,Elf_Xword value)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)value;
  uVar1 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  if ((this->convertor).need_conversion == false) {
    uVar1 = uVar2;
  }
  (this->header).sh_flags = uVar1;
  return;
}

Assistant:

uint32_t
    operator()( uint32_t value ) const
    {
        if ( !need_conversion ) {
            return value;
        }
        value =
            ( ( value & 0x000000FF ) << 24 ) |
            ( ( value & 0x0000FF00 ) <<  8 ) |
            ( ( value & 0x00FF0000 ) >>  8 ) |
            ( ( value & 0xFF000000 ) >> 24 );

        return value;
    }